

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void * __thiscall Js::FunctionProxy::GetAuxPtr(FunctionProxy *this,AuxPointerType e)

{
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *pAVar1;
  code *pcVar2;
  bool bVar3;
  ThreadContext *pTVar4;
  undefined4 *puVar5;
  long lVar6;
  uint8 u;
  
  if ((this->auxPtrs).ptr != (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)0x0) {
    pTVar4 = ThreadContext::GetContextForCurrentThread();
    if ((pTVar4 == (ThreadContext *)0x0) &&
       (bVar3 = CCLock::IsLocked(&ThreadContext::s_csThreadContext.super_CCLock), !bVar3)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x70,
                                  "(ThreadContext::GetContextForCurrentThread() || ThreadContext::GetCriticalSection()->IsLocked())"
                                  ,
                                  "ThreadContext::GetContextForCurrentThread() || ThreadContext::GetCriticalSection()->IsLocked()"
                                 );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    pAVar1 = (this->auxPtrs).ptr;
    if (pAVar1->count == '\x03') {
      lVar6 = 1;
      do {
        if (pAVar1->offsets[lVar6 + -2] == e) {
          return *(void **)(pAVar1->offsets + lVar6 * 8 + -2);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      return (void *)0x0;
    }
    if (pAVar1->count == '\x01') {
      if (pAVar1->capacity == e) {
        return *(void **)(pAVar1->offsets + 6);
      }
    }
    else if ((ulong)pAVar1->offsets[e] != 0xff) {
      return pAVar1->ptrs[pAVar1->offsets[e]].ptr;
    }
  }
  return (void *)0x0;
}

Assistant:

void* FunctionProxy::GetAuxPtr(AuxPointerType e) const
    {
        if (this->auxPtrs == nullptr)
        {
            return nullptr;
        }

        // On process detach this can be called from another thread but the ThreadContext should be locked
        Assert(ThreadContext::GetContextForCurrentThread() || ThreadContext::GetCriticalSection()->IsLocked());
        return AuxPtrsT::GetAuxPtr(this, e);
    }